

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O2

int ovf::detail::parse::segment_data<float>
              (ovf_file *file,int index,ovf_segment *segment,float *data)

{
  parser_state *ppVar1;
  int iVar2;
  bool bVar3;
  int *in_R8;
  exception ex;
  float *data_local;
  parse_error err;
  string local_38 [32];
  
  data_local = data;
  tao::pegtl::
  memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>::
  memory_input<char_const(&)[1]>
            ((memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
              *)&err,(file->_state->file_contents).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + index,(char (*) [1])0x146b1e);
  if (file->version == 1) {
    fmt::v5::format<char[71],char_const*,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ex,
               (v5 *)"libovf segment_data: OVF version \'{}\' in file \'{}\' is not supported...",
               (char (*) [71])file,(char **)&file->version,in_R8);
LAB_0012cae3:
    std::__cxx11::string::operator=((string *)&file->_state->message_latest,(string *)&ex);
    std::__cxx11::string::~string((string *)&ex);
  }
  else {
    if (file->version != 2) {
      fmt::v5::format<char[71],char_const*,int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ex,
                 (v5 *)"libovf segment_data: OVF version \'{}\' in file \'{}\' is not supported...",
                 (char (*) [71])file,(char **)&file->version,in_R8);
      goto LAB_0012cae3;
    }
    file->_state->max_data_index = segment->valuedim * segment->N;
    bVar3 = tao::pegtl::internal::
            seq<tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::v2::empty_line,_tao::pegtl::ascii::eol>_>,_ovf::detail::parse::v2::begin,_tao::pegtl::ascii::istring<'S',_'e',_'g',_'m',_'e',_'n',_'t'>,_tao::pegtl::ascii::eol,_tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::v2::empty_line,_tao::pegtl::ascii::eol>_>,_ovf::detail::parse::v2::header,_tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::v2::empty_line,_tao::pegtl::ascii::eol>_>,_tao::pegtl::sor<ovf::detail::parse::v2::data_text,_ovf::detail::parse::v2::data_csv,_ovf::detail::parse::v2::data_binary_4,_ovf::detail::parse::v2::data_binary_8>,_tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::v2::empty_line,_tao::pegtl::ascii::eol>_>,_tao::pegtl::until<tao::pegtl::seq<ovf::detail::parse::v2::end,_tao::pegtl::ascii::istring<'S',_'e',_'g',_'m',_'e',_'n',_'t'>_>_>,_tao::pegtl::ascii::eol>
            ::
            match<(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)1,_ovf::detail::parse::v2::ovf_segment_data_action,_tao::pegtl::normal,_tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ovf_file_&,_const_ovf_segment_&,_float_*&>
                      ((memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&err,file,segment,&data_local);
    ppVar1 = file->_state;
    ppVar1->current_column = 0;
    ppVar1->current_line = 0;
    if (bVar3) {
      iVar2 = -1;
      goto LAB_0012cb01;
    }
    std::__cxx11::string::assign((char *)&ppVar1->message_latest);
  }
  iVar2 = -3;
LAB_0012cb01:
  std::__cxx11::string::~string(local_38);
  return iVar2;
}

Assistant:

int segment_data(ovf_file & file, int index, const ovf_segment & segment, scalar * data)
    try
    {
        pegtl::memory_input<> in( file._state->file_contents[index], "" );
        int retcode = OVF_ERROR;
        bool success = false;

        if( file.version == 2 )
        {
            file._state->max_data_index = segment.N*segment.valuedim;
            success = pegtl::parse< v2::segment_data, v2::ovf_segment_data_action >( in, file, segment, data );
            file._state->current_line = 0;
            file._state->current_column = 0;
        }
        else if( file.version == 1 )
        {
            // TODO...
            file._state->message_latest = fmt::format(
                "libovf segment_data: OVF version \'{}\' in file \'{}\' is not supported...",
                file.file_name, file.version);
            return OVF_INVALID;
        }
        else
        {
            file._state->message_latest = fmt::format(
                "libovf segment_data: OVF version \'{}\' in file \'{}\' is not supported...",
                file.file_name, file.version);
            return OVF_INVALID;
        }

        if( success )
        {
            return OVF_OK;
        }
        else
        {
            file._state->message_latest = "libovf segment_data: no success in parsing";
            return OVF_INVALID;
        }
    }
    catch( pegtl::parse_error err )
    {
        file._state->message_latest = fmt::format(
            "libovf segment_data: pegtl parse error \'{}\'", + err.what());
        return OVF_ERROR;
    }
    catch( std::exception ex )
    {
        file._state->message_latest = fmt::format(
            "libovf segment_data: std::exception \'{}\'", + ex.what());
        return OVF_ERROR;
    }
    catch( ... )
    {
        // Make sure it really never crashes
        try
        {
            file._state->message_latest = "libovf segment_data: unknown exception";
            return OVF_ERROR;
        }
        catch( ... )
        {
            std::cerr << "libovf segment_data: unrecoverable error" << '\n';
            return OVF_ERROR;
        }
    }